

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O2

bool __thiscall lunasvg::SVGPointList::parse(SVGPointList *this,string_view input)

{
  pointer pPVar1;
  size_t sVar2;
  bool bVar3;
  value_type local_40;
  string_view local_38;
  
  local_38._M_str = input._M_str;
  local_38._M_len = input._M_len;
  pPVar1 = (this->m_values).super__Vector_base<lunasvg::Point,_std::allocator<lunasvg::Point>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_values).super__Vector_base<lunasvg::Point,_std::allocator<lunasvg::Point>_>._M_impl.
      super__Vector_impl_data._M_finish != pPVar1) {
    (this->m_values).super__Vector_base<lunasvg::Point,_std::allocator<lunasvg::Point>_>._M_impl.
    super__Vector_impl_data._M_finish = pPVar1;
  }
  stripLeadingSpaces(&local_38);
  while (sVar2 = local_38._M_len, local_38._M_len != 0) {
    local_40.x = 0.0;
    local_40.y = 0.0;
    bVar3 = parseNumber<float>(&local_38,&local_40.x);
    if (!bVar3) break;
    bVar3 = skipOptionalSpacesOrComma(&local_38);
    if (!bVar3) break;
    bVar3 = parseNumber<float>(&local_38,&local_40.y);
    if (!bVar3) break;
    std::vector<lunasvg::Point,_std::allocator<lunasvg::Point>_>::push_back
              (&this->m_values,&local_40);
    skipOptionalSpacesOrComma(&local_38);
  }
  return sVar2 == 0;
}

Assistant:

bool SVGPointList::parse(std::string_view input)
{
    m_values.clear();
    stripLeadingSpaces(input);
    while(!input.empty()) {
        Point value;
        if(!parseNumber(input, value.x)
            || !skipOptionalSpacesOrComma(input)
            || !parseNumber(input, value.y)) {
            return false;
        }

        m_values.push_back(value);
        skipOptionalSpacesOrComma(input);
    }

    return true;
}